

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# conncache.c
# Opt level: O0

void Curl_conncache_remove_conn(conncache *connc,connectdata *conn)

{
  connectbundle *cb_ptr;
  connectbundle *bundle;
  connectdata *conn_local;
  conncache *connc_local;
  
  cb_ptr = conn->bundle;
  if (cb_ptr != (connectbundle *)0x0) {
    Curl_bundle_remove_conn(cb_ptr,conn);
    if (cb_ptr->num_connections == 0) {
      conncache_remove_bundle(connc,cb_ptr);
    }
    if (connc != (conncache *)0x0) {
      connc->num_connections = connc->num_connections - 1;
    }
  }
  return;
}

Assistant:

void Curl_conncache_remove_conn(struct conncache *connc,
                                struct connectdata *conn)
{
  struct connectbundle *bundle = conn->bundle;

  /* The bundle pointer can be NULL, since this function can be called
     due to a failed connection attempt, before being added to a bundle */
  if(bundle) {
    Curl_bundle_remove_conn(bundle, conn);
    if(bundle->num_connections == 0) {
      conncache_remove_bundle(connc, bundle);
    }

    if(connc) {
      connc->num_connections--;

      DEBUGF(infof(conn->data, "The cache now contains %d members\n",
                   connc->num_connections));
    }
  }
}